

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity_type.cpp
# Opt level: O3

void __thiscall EnemyType::apply_health_factor(EnemyType *this,double factor)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  
  bVar1 = (this->super_EntityType).field_0x64;
  if ((bVar1 != 0) && (bVar1 != 0xff)) {
    dVar2 = round((double)bVar1 * factor);
    dVar3 = 254.0;
    if (dVar2 <= 254.0) {
      dVar3 = dVar2;
    }
    dVar2 = 1.0;
    if (1.0 <= dVar3) {
      dVar2 = dVar3;
    }
    (this->super_EntityType).field_0x64 = (char)(int)dVar2;
  }
  return;
}

Assistant:

void EnemyType::apply_health_factor(double factor)
{
    if(_health < 255 && _health >= 1)
    {
        double factored_health = std::round(static_cast<uint16_t>(_health) * factor);
        if (factored_health > 254)
            factored_health = 254;
        if (factored_health < 1)
            factored_health = 1;
        _health = static_cast<uint8_t>(factored_health);
    }
}